

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O3

int cmac_generate_subkeys(mbedtls_cipher_context_t *ctx,uchar *K1,uchar *K2)

{
  int iVar1;
  ulong ilen;
  uchar L [16];
  size_t olen;
  uchar auStack_48 [16];
  size_t local_38;
  
  mbedtls_platform_zeroize(auStack_48,0x10);
  ilen = (ulong)ctx->cipher_info->block_size;
  iVar1 = mbedtls_cipher_update(ctx,auStack_48,ilen,auStack_48,&local_38);
  if (iVar1 == 0) {
    iVar1 = cmac_multiply_by_u(K1,auStack_48,ilen);
    if (iVar1 == 0) {
      iVar1 = cmac_multiply_by_u(K2,K1,ilen);
    }
  }
  mbedtls_platform_zeroize(auStack_48,0x10);
  return iVar1;
}

Assistant:

static int cmac_generate_subkeys( mbedtls_cipher_context_t *ctx,
                                  unsigned char* K1, unsigned char* K2 )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char L[MBEDTLS_CIPHER_BLKSIZE_MAX];
    size_t olen, block_size;

    mbedtls_platform_zeroize( L, sizeof( L ) );

    block_size = ctx->cipher_info->block_size;

    /* Calculate Ek(0) */
    if( ( ret = mbedtls_cipher_update( ctx, L, block_size, L, &olen ) ) != 0 )
        goto exit;

    /*
     * Generate K1 and K2
     */
    if( ( ret = cmac_multiply_by_u( K1, L , block_size ) ) != 0 )
        goto exit;

    if( ( ret = cmac_multiply_by_u( K2, K1 , block_size ) ) != 0 )
        goto exit;

exit:
    mbedtls_platform_zeroize( L, sizeof( L ) );

    return( ret );
}